

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t set_timefilter_pathname_wcs(archive_match *a,wchar_t timetype,wchar_t *path)

{
  int *piVar1;
  wchar_t *in_RDX;
  undefined4 in_ESI;
  archive *in_RDI;
  wchar_t r;
  archive_string as;
  char *in_stack_00000048;
  wchar_t in_stack_00000054;
  archive_match *in_stack_00000058;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar2;
  
  if ((in_RDX == (wchar_t *)0x0) || (*in_RDX == L'\0')) {
    archive_set_error(in_RDI,0x16,"pathname is empty");
    wVar2 = L'\xffffffe7';
  }
  else {
    wcslen(in_RDX);
    wVar2 = archive_string_append_from_wcs
                      ((archive_string *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (wchar_t *)in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    if (wVar2 < L'\0') {
      archive_string_free((archive_string *)0x11c7d9);
      piVar1 = __errno_location();
      if (*piVar1 == 0xc) {
        wVar2 = error_nomem((archive_match *)0x11c7ed);
      }
      else {
        archive_set_error(in_RDI,-1,"Failed to convert WCS to MBS");
        wVar2 = L'\xffffffe7';
      }
    }
    else {
      wVar2 = set_timefilter_pathname_mbs(in_stack_00000058,in_stack_00000054,in_stack_00000048);
      archive_string_free((archive_string *)0x11c836);
    }
  }
  return wVar2;
}

Assistant:

static int
set_timefilter_pathname_wcs(struct archive_match *a, int timetype,
    const wchar_t *path)
{
	struct archive_string as;
	int r;

	if (path == NULL || *path == L'\0') {
		archive_set_error(&(a->archive), EINVAL, "pathname is empty");
		return (ARCHIVE_FAILED);
	}

	/* Convert WCS filename to MBS filename. */
	archive_string_init(&as);
	if (archive_string_append_from_wcs(&as, path, wcslen(path)) < 0) {
		archive_string_free(&as);
		if (errno == ENOMEM)
			return (error_nomem(a));
		archive_set_error(&(a->archive), -1,
		    "Failed to convert WCS to MBS");
		return (ARCHIVE_FAILED);
	}

	r = set_timefilter_pathname_mbs(a, timetype, as.s);
	archive_string_free(&as);

	return (r);
}